

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

void __thiscall QRingBuffer::chop(QRingBuffer *this,qint64 bytes)

{
  bool bVar1;
  QRingChunk *pQVar2;
  qsizetype qVar3;
  QRingBuffer *in_RSI;
  QList<QRingChunk> *in_RDI;
  QRingChunk *chunk;
  qsizetype chunkSize;
  QList<QRingChunk> *in_stack_ffffffffffffffe0;
  QList<QRingChunk> *in_stack_ffffffffffffffe8;
  
  while( true ) {
    if ((long)in_RSI < 1) {
      return;
    }
    pQVar2 = QList<QRingChunk>::constLast(in_stack_ffffffffffffffe8);
    in_stack_ffffffffffffffe8 = (QList<QRingChunk> *)QRingChunk::size(pQVar2);
    qVar3 = QList<QRingChunk>::size(in_RDI);
    if ((qVar3 == 1) || ((long)in_RSI < (long)in_stack_ffffffffffffffe8)) break;
    in_RDI[1].d.d = (Data *)((long)in_RDI[1].d.d - (long)in_stack_ffffffffffffffe8);
    in_RSI = (QRingBuffer *)((long)in_RSI - (long)in_stack_ffffffffffffffe8);
    QList<QRingChunk>::removeLast(in_stack_ffffffffffffffe0);
  }
  pQVar2 = QList<QRingChunk>::last(in_RDI);
  if ((QRingBuffer *)in_RDI[1].d.d == in_RSI) {
    qVar3 = QRingChunk::capacity((QRingChunk *)0x62c0f5);
    if ((qVar3 <= *(int *)&in_RDI[1].d.ptr) &&
       (bVar1 = QRingChunk::isShared((QRingChunk *)0x62c10c), !bVar1)) {
      QRingChunk::reset(pQVar2);
      in_RDI[1].d.d = (Data *)0x0;
      return;
    }
    clear(in_RSI);
    return;
  }
  QRingChunk::grow(pQVar2,-(long)in_RSI);
  in_RDI[1].d.d = (Data *)((long)in_RDI[1].d.d - (long)in_RSI);
  return;
}

Assistant:

void QRingBuffer::chop(qint64 bytes)
{
    Q_ASSERT(bytes <= bufferSize);

    while (bytes > 0) {
        const qsizetype chunkSize = buffers.constLast().size();

        if (buffers.size() == 1 || chunkSize > bytes) {
            QRingChunk &chunk = buffers.last();
            // keep a single block around if it does not exceed
            // the basic block size, to avoid repeated allocations
            // between uses of the buffer
            if (bufferSize == bytes) {
                if (chunk.capacity() <= basicBlockSize && !chunk.isShared()) {
                    chunk.reset();
                    bufferSize = 0;
                } else {
                    clear(); // try to minify/squeeze us
                }
            } else {
                Q_ASSERT(bytes < QByteArray::maxSize());
                chunk.grow(-bytes);
                bufferSize -= bytes;
            }
            return;
        }

        bufferSize -= chunkSize;
        bytes -= chunkSize;
        buffers.removeLast();
    }
}